

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void make_inner_chamber_wall(chunk *c,wchar_t y,wchar_t x)

{
  _Bool _Var1;
  loc grid;
  square *psVar2;
  
  grid = (loc)loc(x,y);
  psVar2 = square((chunk_conflict *)c,grid);
  if ((FEAT_GRANITE != (uint)psVar2->feat) &&
     (psVar2 = square((chunk_conflict *)c,grid), FEAT_MAGMA != (uint)psVar2->feat)) {
    return;
  }
  _Var1 = square_iswall_outer((chunk_conflict *)c,grid);
  if ((!_Var1) && (_Var1 = square_iswall_solid((chunk_conflict *)c,grid), !_Var1)) {
    square_set_feat((chunk_conflict *)c,grid,FEAT_GRANITE);
    generate_mark(c,grid.y,grid.x,grid.y,grid.x,L'\v');
    return;
  }
  return;
}

Assistant:

static void make_inner_chamber_wall(struct chunk *c, int y, int x)
{
	struct loc grid = loc(x, y);
	if ((square(c, grid)->feat != FEAT_GRANITE) &&
		(square(c, grid)->feat != FEAT_MAGMA))
		return;
	if (square_iswall_outer(c, grid)) return;
	if (square_iswall_solid(c, grid)) return;
	set_marked_granite(c, grid, SQUARE_WALL_INNER);
}